

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe_LPGCachePolicy.cpp
# Opt level: O0

GMM_STATUS __thiscall GmmLib::GmmXe_LPGCachePolicy::SetupPAT(GmmXe_LPGCachePolicy *this)

{
  GMM_PRIVATE_PAT *pGVar1;
  uint local_1c;
  uint32_t i;
  GMM_PRIVATE_PAT *pPATTlbElement;
  GmmXe_LPGCachePolicy *this_local;
  
  pGVar1 = Context::GetPrivatePATTable
                     ((this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.
                      super_GmmGen10CachePolicy.super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.
                      super_GmmCachePolicyCommon.pGmmLibContext);
  for (local_1c = 0;
      local_1c <
      (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy.
      super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.NumPATRegisters;
      local_1c = local_1c + 1) {
    pGVar1[local_1c].Value = pGVar1[local_1c].Value & 0xfffffffc;
    pGVar1[local_1c].Value = pGVar1[local_1c].Value & 0xfffffff3 | 0xc;
    pGVar1[local_1c].Value = pGVar1[local_1c].Value & 0xf;
  }
  pGVar1->Value = pGVar1->Value & 0xfffffffc;
  pGVar1->Value = pGVar1->Value & 0xfffffff3;
  pGVar1->Value = pGVar1->Value & 0xf;
  pGVar1[1].Value = pGVar1[1].Value & 0xfffffffc;
  pGVar1[1].Value = pGVar1[1].Value & 0xfffffff3 | 4;
  pGVar1[1].Value = pGVar1[1].Value & 0xf;
  pGVar1[2].Value = pGVar1[2].Value & 0xfffffffc;
  pGVar1[2].Value = pGVar1[2].Value & 0xfffffff3 | 0xc;
  pGVar1[2].Value = pGVar1[2].Value & 0xf;
  pGVar1[3].Value = pGVar1[3].Value & 0xfffffffc | 2;
  pGVar1[3].Value = pGVar1[3].Value & 0xfffffff3;
  pGVar1[3].Value = pGVar1[3].Value & 0xf;
  pGVar1[4].Value = pGVar1[4].Value & 0xfffffffc | 3;
  pGVar1[4].Value = pGVar1[4].Value & 0xfffffff3;
  pGVar1[4].Value = pGVar1[4].Value & 0xf;
  *(undefined4 *)&(this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.field_0x2c = 4;
  return GMM_SUCCESS;
}

Assistant:

GMM_STATUS GmmLib::GmmXe_LPGCachePolicy::SetupPAT()
{
    GMM_PRIVATE_PAT *pPATTlbElement = &(pGmmLibContext->GetPrivatePATTable()[0]);

#define L4_WB (0x0)
#define L4_WT (0x1)
#define L4_UC (0x3)

#define GMM_DEFINE_PAT_ELEMENT(indx, L4Caching, Coh)       \
    {                                                      \
        pPATTlbElement[indx].Xe_LPG.Coherency = Coh;       \
        pPATTlbElement[indx].Xe_LPG.L4CC      = L4Caching; \
        pPATTlbElement[indx].Xe_LPG.Reserved  = 0;         \
    }

    // clang-format off

    // Default PAT Table
    for (uint32_t i = 0; i < NumPATRegisters; i++)
    {   //                      Index      CachingPolicy       Coherency
        GMM_DEFINE_PAT_ELEMENT( i,          L4_UC              , 0 );
    }

    // Fixed PAT Table
    //                      Index   CachingPolicy   Coherency
    GMM_DEFINE_PAT_ELEMENT( 0      , L4_WB              , 0)    // PATRegValue = 0x0
    GMM_DEFINE_PAT_ELEMENT( 1      , L4_WT              , 0)    // PATRegValue = 0x4
    GMM_DEFINE_PAT_ELEMENT( 2      , L4_UC              , 0)    // PATRegValue = 0xC
    GMM_DEFINE_PAT_ELEMENT( 3      , L4_WB              , 2)    // PATRegValue = 0x2
    GMM_DEFINE_PAT_ELEMENT( 4      , L4_WB              , 3)    // PATRegValue = 0x3

    CurrentMaxPATIndex = 4;

// clang-format on
#undef GMM_DEFINE_PAT
#undef L4_WB
#undef L4_WT
#undef L4_UC
    return GMM_SUCCESS;
}